

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-value.c
# Opt level: O1

void test_uint32(void)

{
  int iVar1;
  VALUE_TYPE VVar2;
  int32_t iVar3;
  uint32_t uVar4;
  int64_t iVar5;
  uint64_t uVar6;
  uint uVar7;
  float fVar8;
  double dVar9;
  VALUE v;
  VALUE VStack_38;
  
  iVar1 = value_init_uint32((VALUE *)0x0,0);
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xda,"%s","value_init_uint32(NULL, 0) != 0");
  value_init_uint32(&VStack_38,0);
  VVar2 = value_type(&VStack_38);
  acutest_check_((uint)(VVar2 == VALUE_UINT32),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xdd,"%s","value_type(&v) == VALUE_UINT32");
  iVar1 = value_is_compatible(&VStack_38,VALUE_NULL);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xde,"%s","!value_is_compatible(&v, VALUE_NULL)");
  uVar7 = 1;
  iVar1 = value_is_compatible(&VStack_38,VALUE_BOOL);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xdf,"%s","!value_is_compatible(&v, VALUE_BOOL)");
  iVar1 = value_is_compatible(&VStack_38,VALUE_INT32);
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xe0,"%s","value_is_compatible(&v, VALUE_INT32)");
  iVar1 = value_is_compatible(&VStack_38,VALUE_UINT32);
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xe1,"%s","value_is_compatible(&v, VALUE_UINT32)");
  iVar1 = value_is_compatible(&VStack_38,VALUE_INT64);
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xe2,"%s","value_is_compatible(&v, VALUE_INT64)");
  iVar1 = value_is_compatible(&VStack_38,VALUE_UINT64);
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xe3,"%s","value_is_compatible(&v, VALUE_UINT64)");
  iVar1 = value_is_compatible(&VStack_38,VALUE_FLOAT);
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xe4,"%s","value_is_compatible(&v, VALUE_FLOAT)");
  iVar1 = value_is_compatible(&VStack_38,VALUE_DOUBLE);
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xe5,"%s","value_is_compatible(&v, VALUE_DOUBLE)");
  iVar1 = value_is_compatible(&VStack_38,VALUE_ARRAY);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xe6,"%s","!value_is_compatible(&v, VALUE_ARRAY)");
  iVar1 = value_is_compatible(&VStack_38,VALUE_DICT);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xe7,"%s","!value_is_compatible(&v, VALUE_DICT)");
  iVar3 = value_int32(&VStack_38);
  acutest_check_((uint)(iVar3 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xe8,"%s","value_int32(&v) == 0");
  uVar4 = value_uint32(&VStack_38);
  acutest_check_((uint)(uVar4 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xe9,"%s","value_uint32(&v) == 0");
  iVar5 = value_int64(&VStack_38);
  acutest_check_((uint)(iVar5 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xea,"%s","value_int64(&v) == 0");
  uVar6 = value_uint64(&VStack_38);
  acutest_check_((uint)(uVar6 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xeb,"%s","value_uint64(&v) == 0");
  fVar8 = value_float(&VStack_38);
  if (((0.0 < fVar8 * 0.9999) || (fVar8 * 1.0001 < 0.0)) && (uVar7 = 0, fVar8 * 1.0001 <= 0.0)) {
    uVar7 = (uint)(0.0 <= fVar8 * 0.9999);
  }
  acutest_check_(uVar7,
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xec,"%s","FLOAT_EQ(value_float(&v), 0.0f)");
  dVar9 = value_double(&VStack_38);
  if (((0.0 < dVar9 * 0.9999999) || (uVar7 = 1, dVar9 * 1.0000001 < 0.0)) &&
     (uVar7 = 0, dVar9 * 1.0000001 <= 0.0)) {
    uVar7 = (uint)(0.0 <= dVar9 * 0.9999999);
  }
  acutest_check_(uVar7,
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xed,"%s","DOUBLE_EQ(value_double(&v), 0.0)");
  value_fini(&VStack_38);
  value_init_uint32(&VStack_38,0xffffffff);
  VVar2 = value_type(&VStack_38);
  acutest_check_((uint)(VVar2 == VALUE_UINT32),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xf1,"%s","value_type(&v) == VALUE_UINT32");
  iVar1 = value_is_compatible(&VStack_38,VALUE_NULL);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xf2,"%s","!value_is_compatible(&v, VALUE_NULL)");
  uVar7 = 1;
  iVar1 = value_is_compatible(&VStack_38,VALUE_BOOL);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xf3,"%s","!value_is_compatible(&v, VALUE_BOOL)");
  iVar1 = value_is_compatible(&VStack_38,VALUE_INT32);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xf4,"%s","!value_is_compatible(&v, VALUE_INT32)");
  iVar1 = value_is_compatible(&VStack_38,VALUE_UINT32);
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xf5,"%s","value_is_compatible(&v, VALUE_UINT32)");
  iVar1 = value_is_compatible(&VStack_38,VALUE_INT64);
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xf6,"%s","value_is_compatible(&v, VALUE_INT64)");
  iVar1 = value_is_compatible(&VStack_38,VALUE_UINT64);
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xf7,"%s","value_is_compatible(&v, VALUE_UINT64)");
  iVar1 = value_is_compatible(&VStack_38,VALUE_FLOAT);
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xf8,"%s","value_is_compatible(&v, VALUE_FLOAT)");
  iVar1 = value_is_compatible(&VStack_38,VALUE_DOUBLE);
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xf9,"%s","value_is_compatible(&v, VALUE_DOUBLE)");
  iVar1 = value_is_compatible(&VStack_38,VALUE_ARRAY);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xfa,"%s","!value_is_compatible(&v, VALUE_ARRAY)");
  iVar1 = value_is_compatible(&VStack_38,VALUE_DICT);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xfb,"%s","!value_is_compatible(&v, VALUE_DICT)");
  iVar3 = value_int32(&VStack_38);
  acutest_check_((uint)(iVar3 == -1),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xfc,"%s","value_int32(&v) == UINT32_MAX");
  uVar4 = value_uint32(&VStack_38);
  acutest_check_((uint)(uVar4 == 0xffffffff),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xfd,"%s","value_uint32(&v) == UINT32_MAX");
  iVar5 = value_int64(&VStack_38);
  acutest_check_((uint)(iVar5 == 0xffffffff),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xfe,"%s","value_int64(&v) == UINT32_MAX");
  uVar6 = value_uint64(&VStack_38);
  acutest_check_((uint)(uVar6 == 0xffffffff),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0xff,"%s","value_uint64(&v) == UINT32_MAX");
  fVar8 = value_float(&VStack_38);
  if (((4.2949673e+09 < fVar8 * 0.9999) || (fVar8 * 1.0001 < 4.2949673e+09)) &&
     (uVar7 = 0, fVar8 * 1.0001 <= 4.2949673e+09)) {
    uVar7 = (uint)(4.2949673e+09 <= fVar8 * 0.9999);
  }
  acutest_check_(uVar7,
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x100,"%s","FLOAT_EQ(value_float(&v), (float) UINT32_MAX)");
  dVar9 = value_double(&VStack_38);
  if (((4294967295.0 < dVar9 * 0.9999999) || (uVar7 = 1, dVar9 * 1.0000001 < 4294967295.0)) &&
     (uVar7 = 0, dVar9 * 1.0000001 <= 4294967295.0)) {
    uVar7 = (uint)(4294967295.0 <= dVar9 * 0.9999999);
  }
  acutest_check_(uVar7,
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x101,"%s","DOUBLE_EQ(value_double(&v), (double) UINT32_MAX)");
  value_fini(&VStack_38);
  return;
}

Assistant:

static void
test_uint32(void)
{
    VALUE v;

    TEST_CHECK(value_init_uint32(NULL, 0) != 0);

    value_init_uint32(&v, 0U);
    TEST_CHECK(value_type(&v) == VALUE_UINT32);
    TEST_CHECK(!value_is_compatible(&v, VALUE_NULL));
    TEST_CHECK(!value_is_compatible(&v, VALUE_BOOL));
    TEST_CHECK(value_is_compatible(&v, VALUE_INT32));
    TEST_CHECK(value_is_compatible(&v, VALUE_UINT32));
    TEST_CHECK(value_is_compatible(&v, VALUE_INT64));
    TEST_CHECK(value_is_compatible(&v, VALUE_UINT64));
    TEST_CHECK(value_is_compatible(&v, VALUE_FLOAT));
    TEST_CHECK(value_is_compatible(&v, VALUE_DOUBLE));
    TEST_CHECK(!value_is_compatible(&v, VALUE_ARRAY));
    TEST_CHECK(!value_is_compatible(&v, VALUE_DICT));
    TEST_CHECK(value_int32(&v) == 0);
    TEST_CHECK(value_uint32(&v) == 0);
    TEST_CHECK(value_int64(&v) == 0);
    TEST_CHECK(value_uint64(&v) == 0);
    TEST_CHECK(FLOAT_EQ(value_float(&v), 0.0f));
    TEST_CHECK(DOUBLE_EQ(value_double(&v), 0.0));
    value_fini(&v);

    value_init_uint32(&v, UINT32_MAX);
    TEST_CHECK(value_type(&v) == VALUE_UINT32);
    TEST_CHECK(!value_is_compatible(&v, VALUE_NULL));
    TEST_CHECK(!value_is_compatible(&v, VALUE_BOOL));
    TEST_CHECK(!value_is_compatible(&v, VALUE_INT32));
    TEST_CHECK(value_is_compatible(&v, VALUE_UINT32));
    TEST_CHECK(value_is_compatible(&v, VALUE_INT64));
    TEST_CHECK(value_is_compatible(&v, VALUE_UINT64));
    TEST_CHECK(value_is_compatible(&v, VALUE_FLOAT));
    TEST_CHECK(value_is_compatible(&v, VALUE_DOUBLE));
    TEST_CHECK(!value_is_compatible(&v, VALUE_ARRAY));
    TEST_CHECK(!value_is_compatible(&v, VALUE_DICT));
    TEST_CHECK(value_int32(&v) == UINT32_MAX);
    TEST_CHECK(value_uint32(&v) == UINT32_MAX);
    TEST_CHECK(value_int64(&v) == UINT32_MAX);
    TEST_CHECK(value_uint64(&v) == UINT32_MAX);
    TEST_CHECK(FLOAT_EQ(value_float(&v), (float) UINT32_MAX));
    TEST_CHECK(DOUBLE_EQ(value_double(&v), (double) UINT32_MAX));
    value_fini(&v);
}